

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<float>::make_l1_norm(default_cost_type<float> *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  int i;
  ulong uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  pfVar2 = (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
           _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  fVar5 = 0.0;
  uVar4 = 0;
  while ((uint)n != uVar4) {
    pfVar1 = pfVar2 + uVar4;
    uVar4 = uVar4 + 1;
    auVar3 = vandps_avx(ZEXT416((uint)*pfVar1),auVar6);
    fVar5 = fVar5 + auVar3._0_4_;
  }
  if ((int)ABS(fVar5) - 0x800000U < 0x7f000000) {
    for (uVar4 = 0; (uint)n != uVar4; uVar4 = uVar4 + 1) {
      pfVar2[uVar4] = pfVar2[uVar4] / fVar5;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }